

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops_sse.h
# Opt level: O2

int32_t helper_cvttss2si_x86_64(CPUX86State *env,ZMMReg *s)

{
  int32_t iVar1;
  
  iVar1 = x86_float32_to_int32_round_to_zero(s->_s_ZMMReg[0],&env->sse_status);
  return iVar1;
}

Assistant:

int32_t helper_cvttss2si(CPUX86State *env, ZMMReg *s)
{
    return x86_float32_to_int32_round_to_zero(s->ZMM_S(0), &env->sse_status);
}